

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O1

Vec_Int_t * Acec_BuildTree(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Wec_t *vLeafLits,Vec_Int_t *vRootLits)

{
  int iVar1;
  uint uVar2;
  void *__ptr;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = vLeafLits->nSize;
  p_00 = (Vec_Wec_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  if (iVar8 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar8,0x10);
  }
  p_00->pArray = pVVar6;
  p_00->nSize = iVar1;
  if ((vRootLits != (Vec_Int_t *)0x0) && (0 < vRootLits->nSize)) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      iVar1 = vRootLits->pArray[lVar10];
      if (lVar10 < p_00->nSize) {
        pVVar6 = (Vec_Int_t *)((long)&p_00->pArray->nCap + lVar9);
      }
      else {
        pVVar6 = Vec_WecPushLevel(p_00);
      }
      Vec_IntPush(pVVar6,iVar1);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar10 < vRootLits->nSize);
  }
  if (0 < vLeafLits->nSize) {
    lVar9 = 0;
    do {
      pVVar6 = vLeafLits->pArray;
      if (0 < pVVar6[lVar9].nSize) {
        uVar4 = (int)lVar9 + 1;
        lVar10 = 0;
        do {
          uVar2 = pVVar6[lVar9].pArray[lVar10];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (p->nObjs <= (int)(uVar2 >> 1)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar5 = Acec_InsertBox_rec(pNew,p,p->pObjs + (uVar2 >> 1));
          if ((int)uVar5 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          if (p_00->nSize <= lVar9) {
            uVar3 = p_00->nSize * 2;
            if ((int)uVar3 <= (int)uVar4) {
              uVar3 = uVar4;
            }
            iVar1 = p_00->nCap;
            if (iVar1 < (int)uVar3) {
              if (p_00->pArray == (Vec_Int_t *)0x0) {
                pVVar7 = (Vec_Int_t *)malloc((ulong)uVar3 << 4);
              }
              else {
                pVVar7 = (Vec_Int_t *)realloc(p_00->pArray,(ulong)uVar3 << 4);
              }
              p_00->pArray = pVVar7;
              memset(pVVar7 + iVar1,0,(long)(int)(uVar3 - iVar1) << 4);
              p_00->nCap = uVar3;
            }
            p_00->nSize = uVar4;
          }
          if (p_00->nSize <= lVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(p_00->pArray + lVar9,uVar5 ^ uVar2 & 1);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar6[lVar9].nSize);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vLeafLits->nSize);
  }
  pVVar6 = Acec_InsertTree(pNew,p_00);
  iVar1 = p_00->nCap;
  if (0 < (long)iVar1) {
    pVVar7 = p_00->pArray;
    lVar9 = 0;
    do {
      __ptr = *(void **)((long)&pVVar7->pArray + lVar9);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar7->pArray + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar9);
  }
  if (p_00->pArray != (Vec_Int_t *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (Vec_Int_t *)0x0;
  }
  p_00->nCap = 0;
  p_00->nSize = 0;
  free(p_00);
  return pVVar6;
}

Assistant:

Vec_Int_t * Acec_BuildTree( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Wec_t * vLeafLits, Vec_Int_t * vRootLits )
{
    Vec_Wec_t * vLeafMap = Vec_WecStart( Vec_WecSize(vLeafLits) );
    Vec_Int_t * vLevel, * vRootRanks;  
    int i, k, iLit, iLitNew;
    // add roo literals
    if ( vRootLits )
        Vec_IntForEachEntry( vRootLits, iLit, i )
        {
            if ( i < Vec_WecSize(vLeafMap) )
                vLevel = Vec_WecEntry(vLeafMap, i);
            else
                vLevel = Vec_WecPushLevel(vLeafMap);
            Vec_IntPush( vLevel, iLit );
        }
    // add other literals
    Vec_WecForEachLevel( vLeafLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
            iLitNew = Acec_InsertBox_rec( pNew, p, pObj );
            iLitNew = Abc_LitNotCond( iLitNew, Abc_LitIsCompl(iLit) );
            Vec_WecPush( vLeafMap, i, iLitNew );
        }
    // construct map of root literals
    vRootRanks = Acec_InsertTree( pNew, vLeafMap );
    Vec_WecFree( vLeafMap );
    return vRootRanks;
}